

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThread.cpp
# Opt level: O0

bool __thiscall xmrig::CudaThread::isEqual(CudaThread *this,CudaThread *other)

{
  bool local_11;
  CudaThread *other_local;
  CudaThread *this_local;
  
  local_11 = false;
  if ((((this->m_blocks == other->m_blocks) &&
       (local_11 = false, this->m_threads == other->m_threads)) &&
      (local_11 = false, this->m_affinity == other->m_affinity)) &&
     ((local_11 = false, this->m_index == other->m_index &&
      (local_11 = false, this->m_bfactor == other->m_bfactor)))) {
    local_11 = this->m_bsleep == other->m_bsleep;
  }
  return local_11;
}

Assistant:

bool xmrig::CudaThread::isEqual(const CudaThread &other) const
{
    return m_blocks      == other.m_blocks &&
           m_threads     == other.m_threads &&
           m_affinity    == other.m_affinity &&
           m_index       == other.m_index &&
           m_bfactor     == other.m_bfactor &&
           m_bsleep      == other.m_bsleep;
}